

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

void re2c::keygen<unsigned_char>(FILE *f,size_t count,size_t len,size_t len_match,rule_rank_t match)

{
  uchar n;
  uchar uVar1;
  ulong __n;
  void *__ptr;
  uint uVar2;
  undefined4 local_4c;
  uint32_t i;
  uchar *keys;
  size_t keys_size;
  uchar m;
  size_t len_match_local;
  size_t len_local;
  size_t count_local;
  FILE *f_local;
  rule_rank_t match_local;
  
  n = Skeleton::rule2key<unsigned_char>(match);
  __n = count * 3;
  __ptr = operator_new__(__n);
  local_4c = 0;
  while (local_4c < __n) {
    uVar1 = to_le<unsigned_char>((uchar)len);
    *(uchar *)((long)__ptr + (ulong)local_4c) = uVar1;
    uVar1 = to_le<unsigned_char>((uchar)len_match);
    uVar2 = local_4c + 2;
    *(uchar *)((long)__ptr + (ulong)(local_4c + 1)) = uVar1;
    uVar1 = to_le<unsigned_char>(n);
    local_4c = local_4c + 3;
    *(uchar *)((long)__ptr + (ulong)uVar2) = uVar1;
  }
  fwrite(__ptr,1,__n,(FILE *)f);
  if (__ptr != (void *)0x0) {
    operator_delete__(__ptr);
  }
  return;
}

Assistant:

static void keygen (FILE * f, size_t count, size_t len, size_t len_match, rule_rank_t match)
{
	const key_t m = Skeleton::rule2key<key_t> (match);

	const size_t keys_size = 3 * count;
	key_t * keys = new key_t [keys_size];
	for (uint32_t i = 0; i < keys_size;)
	{
		keys[i++] = to_le<key_t>(static_cast<key_t> (len));
		keys[i++] = to_le<key_t>(static_cast<key_t> (len_match));
		keys[i++] = to_le<key_t>(m);
	}
	fwrite (keys, sizeof (key_t), keys_size, f);
	delete [] keys;
}